

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O2

bool __thiscall
Filesystem::make_dir
          (Filesystem *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  const_iterator __position;
  pointer pbVar1;
  Fcb fcb;
  bool bVar2;
  int iVar3;
  int mfirst;
  Document *this_00;
  long lVar4;
  ostream *poVar5;
  pointer __s1;
  ulong uVar6;
  iterator it;
  Fcb newFcb;
  string needtoMake;
  _Vector_base<Fcb,_std::allocator<Fcb>_> local_48;
  
  __position._M_current =
       (paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (paths->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = std::operator==(__position._M_current,"");
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(paths,__position);
    }
  }
  this_00 = (Document *)operator_new(0x20);
  Document::Document(this_00,this->proot);
  std::__cxx11::string::string
            ((string *)&needtoMake,
             (string *)
             ((paths->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish + -1));
  iVar3 = 5;
  uVar6 = 0;
  do {
    pbVar1 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= uVar6) {
      Document::save(this_00);
      if (this_00->pos != this->proot->pos) {
        Document::~Document(this_00);
        operator_delete(this_00,0x20);
      }
      mfirst = Fat::get_FreeBlock(this->pfat1);
      this->pfat1->filelist[mfirst] = 0xffff;
      initFcb(&newFcb,needtoMake._M_dataplus._M_p,"",'\0',0,0,mfirst,0,'\x01');
      fcb.exname[0] = newFcb.exname[0];
      fcb.exname[1] = newFcb.exname[1];
      fcb.exname[2] = newFcb.exname[2];
      fcb.attribute = newFcb.attribute;
      fcb.time = newFcb.time;
      fcb.date = newFcb.date;
      fcb.filename[0] = newFcb.filename[0];
      fcb.filename[1] = newFcb.filename[1];
      fcb.filename[2] = newFcb.filename[2];
      fcb.filename[3] = newFcb.filename[3];
      fcb.filename[4] = newFcb.filename[4];
      fcb.filename[5] = newFcb.filename[5];
      fcb.filename[6] = newFcb.filename[6];
      fcb.filename[7] = newFcb.filename[7];
      fcb.first = newFcb.first;
      fcb._20_4_ = newFcb._20_4_;
      fcb.length = newFcb.length;
      fcb.free = newFcb.free;
      fcb._33_7_ = newFcb._33_7_;
      bVar2 = add_fcb(this,iVar3,fcb);
      if (!bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"[Err]Cannot make this fold!");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
LAB_00106e61:
      std::__cxx11::string::~string((string *)&needtoMake);
      return bVar2;
    }
    __s1 = (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
           super__Vector_impl_data._M_start;
    lVar4 = ((long)(this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)__s1) / 0x28;
    while( true ) {
      bVar2 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar2) {
        bVar2 = false;
        goto LAB_00106e61;
      }
      iVar3 = strcmp(__s1->filename,pbVar1[uVar6]._M_dataplus._M_p);
      if ((iVar3 == 0) && (__s1->attribute == '\0')) break;
      __s1 = __s1 + 1;
    }
    iVar3 = __s1->first;
    if (this_00->pos != this->proot->pos) {
      Document::~Document(this_00);
      operator_delete(this_00,0x20);
    }
    copy_file_vec((vector<Fcb,_std::allocator<Fcb>_> *)&newFcb,this,iVar3);
    this_00 = (Document *)operator_new(0x20);
    std::vector<Fcb,_std::allocator<Fcb>_>::vector
              ((vector<Fcb,_std::allocator<Fcb>_> *)&local_48,
               (vector<Fcb,_std::allocator<Fcb>_> *)&newFcb);
    Document::Document(this_00,(vector<Fcb,_std::allocator<Fcb>_> *)&local_48);
    std::_Vector_base<Fcb,_std::allocator<Fcb>_>::~_Vector_base(&local_48);
    std::_Vector_base<Fcb,_std::allocator<Fcb>_>::~_Vector_base
              ((_Vector_base<Fcb,_std::allocator<Fcb>_> *)&newFcb);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool Filesystem::make_dir(vector<string> paths)
{

    if (!paths.empty())
    {
        auto it = paths.begin();
        if (*it == "")
            paths.erase(it);
    }


    Document *curDir = new Document(*proot);
    Fcb curFcb;
    bool findFlag = false;
    int blockId = 5;

   blockId = 5;


    string needtoMake = paths.back();

    for(int j=0;j<paths.size()-1;j++)
    {
        // search curDir
        for (int i = 0; i < curDir->fcbList.size(); ++i)
        {
            if (strcmp(curDir->fcbList[i].filename,paths[j].c_str()) ==0)
            {
                if (curDir->fcbList[i].attribute==0)
                {
                    findFlag = true;
                    curFcb = curDir->fcbList[i];
                    blockId = curFcb.first;
                    break;
                }

            }
        }
        if (!findFlag)
        {
            return false;
        }
        else
        {
            if (curDir->pos != proot->pos)
                delete curDir;
            auto vec = copy_file_vec(blockId);

            curDir = new Document(vec);
            findFlag = false;
        }
    }

    curDir->save();
    if (curDir->pos!=proot->pos)
        delete curDir;

    /// create the file in curDir
    Fcb newFcb;
    //allocate new block
    int newBlock = pfat1->get_FreeBlock();
    (*pfat1)[newBlock] = END;
    initFcb(newFcb,needtoMake.c_str(),"",0,0,0,newBlock,0,1);
    if(!add_fcb(blockId,newFcb))
    {
        cout << "[Err]Cannot make this fold!"<<endl;
        return false;
    }



    return true;

}